

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::
PerformAction<bool(n_e_s::core::INesController::Button)>
          (Action<bool_(n_e_s::core::INesController::Button)> *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  Result value;
  ActionResultHolder<bool> *this_00;
  tuple<n_e_s::core::INesController::Button> local_20;
  Wrapper local_19;
  tuple<n_e_s::core::INesController::Button> *local_18;
  ArgumentTuple *args_local;
  Action<bool_(n_e_s::core::INesController::Button)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<bool> *)operator_new(0x10);
  this = args_local;
  std::tuple<n_e_s::core::INesController::Button>::tuple(&local_20,local_18);
  value = Action<bool_(n_e_s::core::INesController::Button)>::Perform
                    ((Action<bool_(n_e_s::core::INesController::Button)> *)this,&local_20);
  ReferenceOrValueWrapper<bool>::ReferenceOrValueWrapper(&local_19,value);
  ActionResultHolder(this_00,local_19);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }